

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O2

void __thiscall
Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_3,_false>::Block
          (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false> *this,
          Matrix<double,__1,__1,_0,__1,__1> *xpr,Index startRow,Index startCol,Index blockRows,
          Index blockCols)

{
  internal::BlockImpl_dense<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_3,_false,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,_3,_false,_true> *)
                  this,xpr,startRow,startCol,blockRows,blockCols);
  if ((blockRows != 1) || (blockCols != 3)) {
    __assert_fail("(RowsAtCompileTime==Dynamic || RowsAtCompileTime==blockRows) && (ColsAtCompileTime==Dynamic || ColsAtCompileTime==blockCols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Block.h"
                  ,0x91,
                  "Eigen::Block<Eigen::Matrix<double, -1, -1>, 1, 3>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = 3, InnerPanel = false]"
                 );
  }
  if ((((-1 < startRow) && (-1 < startCol)) &&
      (startRow <
       (xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows)) &&
     (startCol <=
      (xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols + -3)
     ) {
    return;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Block.h"
                ,0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, -1>, 1, 3>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = 3, InnerPanel = false]"
               );
}

Assistant:

Block(XprType& xpr,
          Index startRow, Index startCol,
          Index blockRows, Index blockCols)
      : Impl(xpr, startRow, startCol, blockRows, blockCols)
    {
      eigen_assert((RowsAtCompileTime==Dynamic || RowsAtCompileTime==blockRows)
          && (ColsAtCompileTime==Dynamic || ColsAtCompileTime==blockCols));
      eigen_assert(startRow >= 0 && blockRows >= 0 && startRow  <= xpr.rows() - blockRows
          && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols);
    }